

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::readChar(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte bVar1;
  uint uVar2;
  allocator<char> local_51;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string local_40 [32];
  
  requireDStackDepth(this,1,"READ-CHAR");
  requireDStackAvailable(this,1,"READ-CHAR");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"READ-CHAR",&local_51);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_40);
  std::__cxx11::string::~string(local_40);
  std::ios::clear((int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  (int)*(undefined8 *)
                        (*(long *)f.
                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + -0x18));
  bVar1 = std::istream::get();
  ForthStack<unsigned_int>::setTop(this_00,(uint)bVar1);
  ForthStack<unsigned_int>::push
            (this_00,-(*(uint *)(f.
                                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                                *(long *)(*(long *)f.
                                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + -0x18) + 0x20) & 1) & 0xffffffba);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void readChar() {
	REQUIRE_DSTACK_DEPTH(1, "READ-CHAR");
	REQUIRE_DSTACK_AVAILABLE(1, "READ-CHAR");
	auto h = (dStack.getTop());
	auto f = GetFileHandle(h, "READ-CHAR", errorReadFile);
	f->clear();
	auto ch = static_cast<unsigned char>(f->get());
	auto status = f->rdstate();
	dStack.setTop(static_cast<Cell>(ch));
	if (f->bad()) push(static_cast<Cell>(errorReadFile)); else push(0);
}